

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_inherit_swap
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,Int prod_dim,LOs *keys2edges,
               LOs *keys2prods,LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  Mesh *new_mesh_00;
  TransferOpts *old_mesh_00;
  bool bVar1;
  Int IVar2;
  int iVar3;
  Read<int> local_198;
  Read<int> local_188;
  Read<int> local_178;
  Read<int> local_168;
  Read<int> local_158;
  Read<int> local_148;
  Read<int> local_138;
  Read<int> local_128;
  Read<int> local_118;
  Read<int> local_108;
  Read<int> local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  Read<int> local_c8;
  Read<int> local_b8;
  Read<int> local_a8;
  Read<int> local_98;
  Read<int> local_88 [2];
  Read<int> local_68;
  Read<int> local_58;
  TagBase *local_48;
  TagBase *tagbase;
  LOs *pLStack_38;
  Int i;
  LOs *keys2prods_local;
  LOs *keys2edges_local;
  Mesh *pMStack_20;
  Int prod_dim_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  pLStack_38 = keys2prods;
  keys2prods_local = keys2edges;
  keys2edges_local._4_4_ = prod_dim;
  pMStack_20 = new_mesh;
  new_mesh_local = (Mesh *)opts;
  opts_local = (TransferOpts *)old_mesh;
  for (tagbase._4_4_ = 0; iVar3 = tagbase._4_4_,
      IVar2 = Mesh::ntags((Mesh *)opts_local,keys2edges_local._4_4_), iVar3 < IVar2;
      tagbase._4_4_ = tagbase._4_4_ + 1) {
    local_48 = Mesh::get_tag((Mesh *)opts_local,keys2edges_local._4_4_,tagbase._4_4_);
    bVar1 = should_inherit((Mesh *)opts_local,(TransferOpts *)new_mesh_local,keys2edges_local._4_4_,
                           local_48);
    if (bVar1) {
      iVar3 = (*local_48->_vptr_TagBase[2])();
      old_mesh_00 = opts_local;
      new_mesh_00 = pMStack_20;
      IVar2 = keys2edges_local._4_4_;
      switch(iVar3) {
      case 0:
        Read<int>::Read(&local_58,keys2edges);
        Read<int>::Read(&local_68,keys2prods);
        Read<int>::Read(local_88,prods2new_ents);
        Read<int>::Read(&local_98,same_ents2old_ents);
        Read<int>::Read(&local_a8,same_ents2new_ents);
        transfer_inherit_swap_tmpl<signed_char>
                  ((Mesh *)old_mesh_00,new_mesh_00,IVar2,&local_58,&local_68,local_88,&local_98,
                   &local_a8,local_48);
        Read<int>::~Read(&local_a8);
        Read<int>::~Read(&local_98);
        Read<int>::~Read(local_88);
        Read<int>::~Read(&local_68);
        Read<int>::~Read(&local_58);
        break;
      case 2:
        Read<int>::Read(&local_b8,keys2edges);
        Read<int>::Read(&local_c8,keys2prods);
        Read<int>::Read(&local_d8,prods2new_ents);
        Read<int>::Read(&local_e8,same_ents2old_ents);
        Read<int>::Read(&local_f8,same_ents2new_ents);
        transfer_inherit_swap_tmpl<int>
                  ((Mesh *)old_mesh_00,new_mesh_00,IVar2,&local_b8,&local_c8,&local_d8,&local_e8,
                   &local_f8,local_48);
        Read<int>::~Read(&local_f8);
        Read<int>::~Read(&local_e8);
        Read<int>::~Read(&local_d8);
        Read<int>::~Read(&local_c8);
        Read<int>::~Read(&local_b8);
        break;
      case 3:
        Read<int>::Read(&local_108,keys2edges);
        Read<int>::Read(&local_118,keys2prods);
        Read<int>::Read(&local_128,prods2new_ents);
        Read<int>::Read(&local_138,same_ents2old_ents);
        Read<int>::Read(&local_148,same_ents2new_ents);
        transfer_inherit_swap_tmpl<long>
                  ((Mesh *)old_mesh_00,new_mesh_00,IVar2,&local_108,&local_118,&local_128,&local_138
                   ,&local_148,local_48);
        Read<int>::~Read(&local_148);
        Read<int>::~Read(&local_138);
        Read<int>::~Read(&local_128);
        Read<int>::~Read(&local_118);
        Read<int>::~Read(&local_108);
        break;
      case 5:
        Read<int>::Read(&local_158,keys2edges);
        Read<int>::Read(&local_168,keys2prods);
        Read<int>::Read(&local_178,prods2new_ents);
        Read<int>::Read(&local_188,same_ents2old_ents);
        Read<int>::Read(&local_198,same_ents2new_ents);
        transfer_inherit_swap_tmpl<double>
                  ((Mesh *)old_mesh_00,new_mesh_00,IVar2,&local_158,&local_168,&local_178,&local_188
                   ,&local_198,local_48);
        Read<int>::~Read(&local_198);
        Read<int>::~Read(&local_188);
        Read<int>::~Read(&local_178);
        Read<int>::~Read(&local_168);
        Read<int>::~Read(&local_158);
      }
    }
  }
  return;
}

Assistant:

static void transfer_inherit_swap(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, Int prod_dim, LOs keys2edges, LOs keys2prods,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(prod_dim); ++i) {
    auto tagbase = old_mesh->get_tag(prod_dim, i);
    if (should_inherit(old_mesh, opts, prod_dim, tagbase)) {
      switch (tagbase->type()) {
        case OMEGA_H_I8:
          transfer_inherit_swap_tmpl<I8>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I32:
          transfer_inherit_swap_tmpl<I32>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I64:
          transfer_inherit_swap_tmpl<I64>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_F64:
          transfer_inherit_swap_tmpl<Real>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
      }
    }
  }
}